

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
google::
sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
::find_position<HashObject<8,8>>
          (sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
           *this,HashObject<8,_8> *key)

{
  undefined4 uVar1;
  long lVar2;
  undefined8 uVar3;
  undefined6 uVar4;
  undefined1 auVar5 [12];
  bool bVar6;
  const_reference ppVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  short sVar13;
  undefined1 auVar14 [16];
  pair<unsigned_long,_unsigned_long> pVar19;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 uVar17;
  undefined2 uVar18;
  
  lVar2 = *(long *)(this + 0x48);
  g_num_hashes = g_num_hashes + 1;
  uVar1 = *(undefined4 *)key->buffer_;
  uVar17 = (undefined1)((uint)uVar1 >> 0x18);
  uVar18 = CONCAT11(uVar17,uVar17);
  uVar17 = (undefined1)((uint)uVar1 >> 0x10);
  uVar3 = CONCAT35(CONCAT21(uVar18,uVar17),CONCAT14(uVar17,uVar1));
  uVar17 = (undefined1)((uint)uVar1 >> 8);
  uVar4 = CONCAT51(CONCAT41((int)((ulong)uVar3 >> 0x20),uVar17),uVar17);
  sVar13 = CONCAT11((char)uVar1,(char)uVar1);
  uVar9 = CONCAT62(uVar4,sVar13);
  auVar16._8_4_ = 0;
  auVar16._0_8_ = uVar9;
  auVar16._12_2_ = uVar18;
  auVar16._14_2_ = uVar18;
  uVar18 = (undefined2)((ulong)uVar3 >> 0x20);
  auVar15._12_4_ = auVar16._12_4_;
  auVar15._8_2_ = 0;
  auVar15._0_8_ = uVar9;
  auVar15._10_2_ = uVar18;
  auVar14._10_6_ = auVar15._10_6_;
  auVar14._8_2_ = uVar18;
  auVar14._0_8_ = uVar9;
  uVar18 = (undefined2)uVar4;
  auVar5._4_8_ = auVar14._8_8_;
  auVar5._2_2_ = uVar18;
  auVar5._0_2_ = uVar18;
  uVar11 = (ulong)((auVar15._12_4_ >> 0x18) + (auVar5._0_4_ >> 0x18) +
                  (auVar14._8_4_ >> 0x18) + ((int)sVar13 >> 8) + key->i_);
  uVar9 = 0xffffffffffffffff;
  lVar8 = 1;
  do {
    uVar11 = uVar11 & lVar2 - 1U;
    lVar10 = (uVar11 / 0x30) * 0x10;
    uVar12 = uVar11 % 0x30;
    if ((*(byte *)((uVar12 >> 3) + 10 + *(long *)(this + 0x30) + lVar10) >> ((uint)uVar12 & 7) & 1)
        == 0) {
      uVar12 = uVar11;
      if (uVar9 != 0xffffffffffffffff) {
        uVar12 = uVar9;
      }
      uVar11 = 0xffffffffffffffff;
LAB_0012e2d1:
      pVar19.second = uVar12;
      pVar19.first = uVar11;
      return pVar19;
    }
    bVar6 = sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            ::test_deleted((sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                            *)this,uVar11);
    if (bVar6) {
      if (uVar9 == 0xffffffffffffffff) {
        uVar9 = uVar11;
      }
    }
    else {
      ppVar7 = sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
               ::unsafe_get((sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                             *)(lVar10 + *(long *)(this + 0x30)),(size_type_conflict)uVar12);
      if (key->i_ == (ppVar7->first).i_) {
        uVar12 = 0xffffffffffffffff;
        goto LAB_0012e2d1;
      }
    }
    uVar11 = uVar11 + lVar8;
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    SPARSEHASH_STAT_UPDATE(total_lookups += 1);
    while (1) {                    // probe until something happens
      if (!table.test(bucknum)) {  // bucket is empty
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        if (insert_pos == ILLEGAL_BUCKET)  // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);
      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;
      } else if (equals(key, get_key(table.unsafe_get(bucknum)))) {
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }